

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNodePrivate::MoveAfter(ON_XMLNodePrivate *this,ON_XMLNode *other)

{
  ON_XMLNode *pOVar1;
  ON_XMLNode *pPrev;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNode *other_local;
  ON_XMLNodePrivate *this_local;
  
  if (other != this->m_node) {
    lg._M_device = (mutex_type *)other;
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)&pPrev,&this->m_mutex);
    pOVar1 = PrevSibling(this);
    if (pOVar1 != (ON_XMLNode *)lg._M_device) {
      if (pOVar1 == (ON_XMLNode *)0x0) {
        this->m_parent->_private->m_first_child = this->m_next_sibling;
      }
      else {
        pOVar1->_private->m_next_sibling = this->m_next_sibling;
      }
      this->m_next_sibling =
           *(ON_XMLNode **)
            (*(long *)((long)&((lg._M_device)->super___recursive_mutex_base)._M_mutex + 8) + 0x10);
      *(ON_XMLNode **)
       (*(long *)((long)&((lg._M_device)->super___recursive_mutex_base)._M_mutex + 8) + 0x10) =
           this->m_node;
    }
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&pPrev);
  }
  return;
}

Assistant:

void ON_XMLNodePrivate::MoveAfter(ON_XMLNode& other)
{
  if (&other == &m_node)
    return;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  auto* pPrev = PrevSibling();
  if (pPrev == &other)
    return;

  if (nullptr != pPrev)
  {
    pPrev->_private->m_next_sibling = m_next_sibling;
  }
  else
  {
    // 'this' was the head; redirect the parent's first child.
    m_parent->_private->m_first_child = m_next_sibling;
  }

  m_next_sibling = other._private->m_next_sibling;

  other._private->m_next_sibling = &m_node;
}